

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  ATTRIBUTE *pAVar6;
  
LAB_0034adbf:
  while( true ) {
    uVar4 = (long)end - (long)ptr;
    if ((long)uVar4 < 1) {
      return -1;
    }
    bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    pAVar6 = (ATTRIBUTE *)(ulong)bVar1;
    if (pAVar6 < (ATTRIBUTE *)0xe) break;
switchD_0034ade8_caseD_2:
    ptr = (char *)((byte *)ptr + 1);
  }
  switch(pAVar6) {
  case (ATTRIBUTE *)0x0:
  case (ATTRIBUTE *)0x1:
  case (ATTRIBUTE *)0x8:
    break;
  default:
    goto switchD_0034ade8_caseD_2;
  case (ATTRIBUTE *)0x5:
    if (uVar4 == 1) {
      return -2;
    }
    iVar2 = (*enc[3].nameLength)(enc,ptr);
    if (iVar2 == 0) {
      ptr = (char *)((byte *)ptr + 2);
      goto LAB_0034adbf;
    }
    break;
  case (ATTRIBUTE *)0x6:
    if (uVar4 < 3) {
      return -2;
    }
    pcVar5 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar5 == 0) {
      ptr = (char *)((byte *)ptr + 3);
      goto LAB_0034adbf;
    }
    break;
  case (ATTRIBUTE *)0x7:
    if (uVar4 < 4) {
      return -2;
    }
    iVar2 = (*enc[3].getAtts)(enc,ptr,(&switchD_0034ade8::switchdataD_00490324)[(long)pAVar6] +
                                      0x490324,pAVar6);
    if (iVar2 == 0) {
      ptr = (char *)((byte *)ptr + 4);
      goto LAB_0034adbf;
    }
    break;
  case (ATTRIBUTE *)0xc:
  case (ATTRIBUTE *)0xd:
    goto switchD_0034ade8_caseD_c;
  }
  *nextTokPtr = ptr;
  goto LAB_0034ae5f;
switchD_0034ade8_caseD_c:
  ptr = (char *)((byte *)ptr + 1);
  if ((uint)bVar1 == open) {
    if (end == ptr || (long)end - (long)ptr < 0) {
      iVar2 = -0x1b;
    }
    else {
      *nextTokPtr = ptr;
      uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      if ((uVar3 < 0x1f) && ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0)) {
        iVar2 = 0x1b;
      }
      else {
LAB_0034ae5f:
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  goto LAB_0034adbf;
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc,
                const char *ptr, const char *end,
                const char **nextTokPtr)
{
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}